

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar2;
  
  if (in_EDI < 2) {
    help_main((int)in_RSI,(char **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  else {
    iVar2 = 0;
    while (commands[iVar2].name != (char *)0x0) {
      iVar1 = strcmp(commands[iVar2].name,in_RSI[1]);
      if (iVar1 == 0) {
        iVar2 = (*commands[iVar2].main)(in_EDI,in_RSI);
        return iVar2;
      }
      iVar2 = iVar2 + 1;
    }
    fprintf(_stderr,"ERROR: Command \'%s\' not found. Try \'%s help\' for a list of commands.\n",
            in_RSI[1],*in_RSI);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc < 2) {
        help_main(argc, argv);
        return EXIT_FAILURE;
    }
    for(int i = 0; commands[i].name != nullptr; ++i) {
        if(strcmp(commands[i].name, argv[1]) == 0) {
            return commands[i].main(argc, argv);
        }
    }
    fprintf(stderr,
            "ERROR: Command '%s' not found. Try '%s help' for a list of "
            "commands.\n",
            argv[1], argv[0]);
    return EXIT_FAILURE;
}